

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::Int64Size(RepeatedField<long> *value)

{
  int iVar1;
  const_reference plVar2;
  size_t sVar3;
  undefined4 local_20;
  int i;
  int n;
  size_t out;
  RepeatedField<long> *value_local;
  
  _i = 0;
  iVar1 = RepeatedField<long>::size(value);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    plVar2 = RepeatedField<long>::Get(value,local_20);
    sVar3 = Int64Size(*plVar2);
    _i = sVar3 + _i;
  }
  return _i;
}

Assistant:

size_t WireFormatLite::Int64Size(const RepeatedField<int64_t>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += Int64Size(value.Get(i));
  }
  return out;
}